

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDVertex::HasInteriorVertexTopology(ON_SubDVertex *this)

{
  ulong uVar1;
  ON_SubDEdge *e;
  unsigned_short vei;
  ON_SubDVertex *this_local;
  
  if ((((this->m_edge_count < 2) || (this->m_edge_count != this->m_face_count)) ||
      (this->m_edges == (ON_SubDEdgePtr *)0x0)) || (this->m_faces == (ON_SubDFace **)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    for (e._6_2_ = 0; e._6_2_ < this->m_edge_count; e._6_2_ = e._6_2_ + 1) {
      uVar1 = this->m_edges[e._6_2_].m_ptr & 0xfffffffffffffff8;
      if ((uVar1 == 0) || (*(short *)(uVar1 + 100) != 2)) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDVertex::HasInteriorVertexTopology() const
{
  if (m_edge_count >= 2 && m_edge_count == m_face_count && nullptr != m_edges && nullptr != m_faces)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e || 2 != e->m_face_count)
        return false;
    }
    return true;
  }    
  return false;
}